

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

int __thiscall
cnn::LookupParameters::copy(LookupParameters *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  bVar1 = operator==(&this->dim,(Dim *)(dst + 8));
  if (bVar1) {
    lVar4 = 0;
    uVar3 = 0;
    while( true ) {
      uVar2 = (*(long *)(dst + 0x38) - *(long *)(dst + 0x30)) / 0x48;
      if (uVar2 <= uVar3) break;
      TensorTools::CopyElements
                ((Tensor *)
                 ((long)(((this->values).
                          super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                          super__Vector_impl_data._M_start)->d).d + lVar4),
                 (Tensor *)(*(long *)(dst + 0x30) + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x48;
    }
    return (int)uVar2;
  }
  __assert_fail("dim == param.dim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/model.cc"
                ,0x8f,"void cnn::LookupParameters::copy(const LookupParameters &)");
}

Assistant:

void LookupParameters::copy(const LookupParameters & param) {
  assert(dim == param.dim);
  for(size_t i = 0; i < param.values.size(); ++i)
    TensorTools::CopyElements(values[i], param.values[i]);
}